

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O2

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHashAndCountVariables
          (HashingClauseVariantIndex *this,TermList *ptl,VarCounts *varCnts,uint hash_begin)

{
  Term *this_00;
  ulong uVar1;
  bool bVar2;
  type tVar3;
  uint uVar4;
  SubtermIterator sti;
  SubtermIterator local_50;
  
  this_00 = (Term *)ptl->_content;
  if (((ulong)this_00 & 1) != 0) {
    uVar4 = computeHashAndCountVariables(this,(uint)((ulong)this_00 >> 2),varCnts,hash_begin);
    return uVar4;
  }
  bVar2 = Kernel::Term::ground(this_00);
  if (bVar2) {
    tVar3 = Lib::DefaultHash::hash<Kernel::Term>(this_00,hash_begin);
    return tVar3;
  }
  tVar3 = Lib::DefaultHash::hash<unsigned_int>(this_00->_functor,hash_begin);
  Kernel::SubtermIterator::SubtermIterator(&local_50,this_00);
  while( true ) {
    bVar2 = Kernel::SubtermIterator::hasNext(&local_50);
    if (!bVar2) break;
    local_50._used = true;
    uVar1 = (*(TermList ***)
              ((long)local_50._stack._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                     _M_head_impl + 0x10))[-1]->_content;
    if ((uVar1 & 1) == 0) {
      tVar3 = Lib::DefaultHash::hash<unsigned_int>(*(uint *)(uVar1 + 8),tVar3);
    }
    else {
      tVar3 = computeHashAndCountVariables(this,(uint)(uVar1 >> 2),varCnts,tVar3);
    }
  }
  Kernel::SubtermIterator::~SubtermIterator(&local_50);
  return tVar3;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHashAndCountVariables(TermList* ptl, VarCounts& varCnts, unsigned hash_begin) {
  if (ptl->isVar()) {
    return computeHashAndCountVariables(ptl->var(),varCnts,hash_begin);
  }

  Term* t = ptl->term();

  if (t->ground()) {
    // no variables to count
    // just hash the pointer
    return DefaultHash::hash(t, hash_begin);
  }

  unsigned hash = termFunctorHash(t,hash_begin);

  SubtermIterator sti(t);
  while(sti.hasNext()) {
    TermList tl = sti.next();

    if (tl.isVar()) {
      hash = computeHashAndCountVariables(tl.var(),varCnts,hash);
    } else {
      hash = termFunctorHash(tl.term(),hash);
    }
  }

  return hash;
}